

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O0

void __thiscall QUrlQueryPrivate::addQueryItem(QUrlQueryPrivate *this,QString *key,QString *value)

{
  long lVar1;
  QString *in_RDI;
  long in_FS_OFFSET;
  rvalue_ref in_stack_ffffffffffffff58;
  pair<QString,_QString> *this_00;
  QString *in_stack_ffffffffffffffa0;
  QUrlQueryPrivate *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (pair<QString,_QString> *)&(in_RDI->d).ptr;
  recodeFromUser(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  recodeFromUser(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::make_pair<QString,QString>(in_RDI,&this_00->first);
  QList<std::pair<QString,_QString>_>::append
            ((QList<std::pair<QString,_QString>_> *)this_00,in_stack_ffffffffffffff58);
  std::pair<QString,_QString>::~pair(this_00);
  QString::~QString((QString *)0x316bd1);
  QString::~QString((QString *)0x316bdb);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void addQueryItem(const QString &key, const QString &value)
    { itemList.append(std::make_pair(recodeFromUser(key), recodeFromUser(value))); }